

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O2

void __thiscall spatial_region::create_arrays(spatial_region *this,int nx0,int ny0,int nz0,int seed)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int i;
  long lVar7;
  allocator_type local_51;
  field3d<cellb> local_50;
  
  this->nx = nx0;
  this->ny = ny0;
  this->nz = nz0;
  field3d<celle>::field3d((field3d<celle> *)&local_50,nx0,ny0,nz0);
  field3d<celle>::operator=(&this->ce,(field3d<celle> *)&local_50);
  field3d<celle>::~field3d((field3d<celle> *)&local_50);
  field3d<cellb>::field3d(&local_50,this->nx,this->ny,this->nz);
  field3d<cellb>::operator=(&this->cb,&local_50);
  field3d<cellb>::~field3d(&local_50);
  field3d<cellj>::field3d((field3d<cellj> *)&local_50,this->nx,this->ny,this->nz);
  field3d<cellj>::operator=(&this->cj,(field3d<cellj> *)&local_50);
  field3d<cellj>::~field3d((field3d<cellj> *)&local_50);
  field3d<cellbe>::field3d((field3d<cellbe> *)&local_50,this->nx,this->ny,this->nz);
  field3d<cellbe>::operator=(&this->cbe,(field3d<cellbe> *)&local_50);
  field3d<cellbe>::~field3d((field3d<cellbe> *)&local_50);
  field3d<cellp>::field3d((field3d<cellp> *)&local_50,this->nx,this->ny,this->nz);
  field3d<cellp>::operator=(&this->cp,(field3d<cellp> *)&local_50);
  field3d<cellp>::~field3d((field3d<cellp> *)&local_50);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::vector
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)&local_50,
             (long)this->n_ion_populations,&local_51);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::_M_move_assign
            (&this->irho,&local_50);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::~vector
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)&local_50);
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < this->n_ion_populations; lVar6 = lVar6 + 1) {
    field3d<double>::field3d((field3d<double> *)&local_50,this->nx,this->ny,this->nz);
    field3d<double>::operator=
              ((field3d<double> *)
               ((long)&((this->irho).
                        super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->nx + lVar7),
               (field3d<double> *)&local_50);
    field3d<double>::~field3d((field3d<double> *)&local_50);
    lVar7 = lVar7 + 0x28;
  }
  pdVar3 = (double *)malloc(0x1b8);
  this->random = pdVar3;
  srand(seed);
  for (lVar6 = 0; lVar6 != 0x37; lVar6 = lVar6 + 1) {
    iVar2 = rand();
    this->random[lVar6] = (double)iVar2 / 2147483647.0;
  }
  uVar1 = this->n_ion_populations;
  __size = (long)(int)uVar1 * 8;
  pdVar3 = (double *)malloc(__size);
  this->ienergy = pdVar3;
  pdVar3 = (double *)malloc(__size);
  this->ienergy_deleted = pdVar3;
  for (uVar5 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
    pdVar3[uVar5] = 0.0;
  }
  piVar4 = (int *)malloc((long)(int)uVar1 << 2);
  this->N_qp_i = piVar4;
  return;
}

Assistant:

void spatial_region::create_arrays(int nx0, int ny0, int nz0, int seed)
{
    nx = nx0;
    ny = ny0;
    nz = nz0;

    void* pv;

    ce = field3d<celle>(nx, ny, nz);
    cb = field3d<cellb>(nx, ny, nz);
    cj = field3d<cellj>(nx, ny, nz);
    cbe = field3d<cellbe>(nx, ny, nz);
    cp = field3d<cellp>(nx, ny, nz);

    irho = vector<field3d<double> >(n_ion_populations);
    for (int n=0;n<n_ion_populations;n++)
    {
        irho[n] = field3d<double>(nx, ny, nz);
    }

    pv = malloc(sizeof(double)*55);
    random = (double*) pv;
    srand(seed);
    for(int i=0;i<55;i++)
    {
        random[i] = (double)rand()/(double)RAND_MAX;
    }

    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy = (double*) pv;
    pv = malloc(sizeof(double)*n_ion_populations);
    ienergy_deleted = (double*) pv;
    for (int i=0; i<n_ion_populations; ++i)
    {
        ienergy_deleted[i] = 0.0;
    }

    pv = malloc(sizeof(int)*n_ion_populations);
    N_qp_i = (int*) pv;
}